

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_emit.hpp
# Opt level: O1

void __thiscall
pstore::exchange::export_ns::emit_string<char_const*>
          (export_ns *this,ostream_base *os,char *first,char *last)

{
  char *pcVar1;
  ostream_base *this_00;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_01;
  extent_type<_1L> local_38 [2];
  
  ostream_base::write((ostream_base *)this,0x22,first,(size_t)last);
  pcVar1 = std::
           __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<pstore::exchange::export_ns::emit_string<char_const*>(pstore::exchange::export_ns::ostream_base&,char_const*,char_const*)::_lambda(char)_1_>>
                     (os,first);
  __buf_01 = extraout_RDX;
  while (pcVar1 != first) {
    gsl::details::extent_type<-1L>::extent_type(local_38,(long)pcVar1 - (long)os);
    ostream_base::write((ostream_base *)this,(int)os,(void *)local_38[0].size_,(size_t)last);
    this_00 = (ostream_base *)ostream_base::write((ostream_base *)this,0x5c,__buf,(size_t)last);
    ostream_base::write(this_00,(int)*pcVar1,__buf_00,(size_t)last);
    os = (ostream_base *)(pcVar1 + 1);
    pcVar1 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<pstore::exchange::export_ns::emit_string<char_const*>(pstore::exchange::export_ns::ostream_base&,char_const*,char_const*)::_lambda(char)_1_>>
                       (os,first);
    __buf_01 = extraout_RDX_00;
  }
  if (os != (ostream_base *)first) {
    gsl::details::extent_type<-1L>::extent_type(local_38,(long)first - (long)os);
    ostream_base::write((ostream_base *)this,(int)os,(void *)local_38[0].size_,(size_t)last);
    __buf_01 = extraout_RDX_01;
  }
  ostream_base::write((ostream_base *)this,0x22,__buf_01,(size_t)last);
  return;
}

Assistant:

void emit_string (ostream_base & os, Iterator first, Iterator last) {
                os << '"';
                auto pos = first;
                while ((pos = std::find_if (first, last, [] (char const c) {
                            return c == '"' || c == '\\';
                        })) != last) {
                    details::write_span (os, gsl::make_span (&*first, pos - first));
                    os << '\\' << *pos;
                    first = pos + 1;
                }
                if (first != last) {
                    details::write_span (os, gsl::make_span (&*first, last - first));
                }
                os << '"';
            }